

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture.h
# Opt level: O1

void __thiscall server::captureservmode::replenishammo(captureservmode *this,clientinfo *ci)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  
  if ((((0x19 < gamemode + 3U) || ((0x85503fUL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) != 0)) &&
      (this->notgotbases == false)) &&
     ((((ci->state).state == 0 && (ci->team[0] != '\0')) &&
      (lVar3 = (long)(this->bases).ulen, 0 < lVar3)))) {
    piVar4 = &((this->bases).buf)->ammo;
    lVar5 = 0;
    do {
      iVar1 = piVar4[-2];
      if (((iVar1 - 1U < 6) &&
          (fVar6 = (((baseinfo *)(piVar4 + -0x88))->o).field_0.field_0.x -
                   (ci->state).o.field_0.field_0.x,
          fVar7 = (float)piVar4[-0x87] - (ci->state).o.field_0.field_0.y,
          fVar6 * fVar6 + fVar7 * fVar7 <= 4096.0)) &&
         ((ABS((float)piVar4[-0x86] - (ci->state).o.field_0.field_0.z) <= 24.0 &&
          ((((ci->state).super_fpsstate.ammo[iVar1] <
             *(int *)((long)&PTR_flush_00182520 + (long)iVar1 * 0x20 + 4) &&
            (iVar1 = strcmp((char *)(piVar4 + -0x85),ci->team), iVar1 == 0)) && (0 < *piVar4)))))) {
        *piVar4 = *piVar4 + -1;
        sendbaseinfo(this,(int)lVar5);
        sendf(-1,1,"riii",0x44,(ulong)(uint)ci->clientnum,(ulong)(uint)piVar4[-2]);
        lVar3 = (long)piVar4[-2];
        iVar1 = *(int *)((long)&PTR_flush_00182520 + lVar3 * 0x20 + 4);
        iVar2 = *(int *)(&PTR_flush_00182520 + lVar3 * 4) + (ci->state).super_fpsstate.ammo[lVar3];
        if (iVar1 <= iVar2) {
          iVar2 = iVar1;
        }
        (ci->state).super_fpsstate.ammo[lVar3] = iVar2;
        return;
      }
      lVar5 = lVar5 + 1;
      piVar4 = piVar4 + 0x8d;
    } while (lVar3 != lVar5);
  }
  return;
}

Assistant:

void replenishammo(clientinfo *ci)
    {
        if(m_noitems || notgotbases || ci->state.state!=CS_ALIVE || !ci->team[0]) return;
        loopv(bases)
        {
            baseinfo &b = bases[i];
            if(b.valid() && insidebase(b, ci->state.o) && !ci->state.hasmaxammo(b.ammotype-1+I_SHELLS) && b.takeammo(ci->team))
            {
                sendbaseinfo(i);
                sendf(-1, 1, "riii", N_REPAMMO, ci->clientnum, b.ammotype);
                ci->state.addammo(b.ammotype);
                break;
            }
        }
    }